

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::isModuleCommonDecl(SyntaxKind kind)

{
  bool bVar1;
  
  if (((0x31 < kind - ClockingDeclaration) ||
      ((0x2200000000001U >> ((ulong)(kind - ClockingDeclaration) & 0x3f) & 1) == 0)) &&
     (kind != GenvarDeclaration)) {
    bVar1 = isModuleOrPackageDecl(kind);
    return bVar1;
  }
  return true;
}

Assistant:

static bool isModuleCommonDecl(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::GenvarDeclaration:
        case SyntaxKind::ClockingDeclaration:
        case SyntaxKind::DefaultClockingReference:
        case SyntaxKind::DefaultDisableDeclaration:
            return true;
        default:
            return isModuleOrPackageDecl(kind);
    }
}